

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

void internal_cod_submit_general
               (cod_exec_context ec,int port,void *data,void *type_info,attr_list attrs,timeval *tp)

{
  CManager cm;
  event_path_data evp;
  FILE *pFVar1;
  _event_item *p_Var2;
  uint uVar3;
  int iVar4;
  __pid_t _Var5;
  ev_state_data *evstate;
  pthread_t pVar6;
  FMFormat p_Var7;
  event_item *event;
  attr_list p_Var8;
  uint *puVar9;
  CMTaskHandle __ptr;
  timespec ts;
  timespec local_40;
  
  evstate = (ev_state_data *)cod_get_client_data(ec,0x34567890);
  cm = evstate->cm;
  evp = cm->evp;
  uVar3 = port_to_stone(evstate,port);
  if (uVar3 == 0xffffffff) {
    printf("Port %d on stone %d invalid\n",(ulong)(uint)port,(ulong)(uint)evstate->stone);
    return;
  }
  iVar4 = CManager_locked(cm);
  if (iVar4 == 0) {
    __assert_fail("CManager_locked(cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                  ,0x65f,
                  "void internal_cod_submit_general(cod_exec_context, int, void *, void *, attr_list, struct timeval *)"
                 );
  }
  evstate->did_output = evstate->did_output + 1;
  if ((evstate->cur_event == (_event_item *)0x0) || (evstate->cur_event->decoded_event != data)) {
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Internal COD submit, submission of new data to stone %d\n",
              (ulong)uVar3);
    }
    fflush((FILE *)cm->CMTrace_file);
    p_Var7 = EVregister_format_set(cm,(FMStructDescList)type_info);
    if (p_Var7 == (FMFormat)0x0) {
      puts("Bad format information on submit");
    }
    else {
      event = get_free_event(evp);
      event->event_encoded = 0;
      event->decoded_event = data;
      event->reference_format = p_Var7;
      event->format = (CMFormat)0x0;
      event->free_func = (EVFreeFunction)0x0;
      event->free_arg = event;
      p_Var8 = (attr_list)add_ref_attr_list(attrs);
      event->attrs = p_Var8;
      event->cm = cm;
      cod_encode_event(cm,event);
      event->event_encoded = 1;
      event->decoded_event = (void *)0x0;
      if (tp == (timeval *)0x0) {
        internal_path_submit(cm,uVar3,event);
        return_event(cm->evp,event);
      }
      else {
        puVar9 = (uint *)INT_CMmalloc(0x10);
        *puVar9 = uVar3;
        *(event_item **)(puVar9 + 2) = event;
        __ptr = INT_CMadd_delayed_task
                          (cm,(int)tp->tv_sec,(int)tp->tv_usec,EVdelayed_submit_func,puVar9);
        free(__ptr);
      }
    }
  }
  else {
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar1 = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar1,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_40);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,
              "Internal COD submit, resubmission of current input event to stone %d\n",(ulong)uVar3)
      ;
    }
    fflush((FILE *)cm->CMTrace_file);
    if (tp == (timeval *)0x0) {
      internal_path_submit(evstate->cm,uVar3,evstate->cur_event);
    }
    else {
      puVar9 = (uint *)INT_CMmalloc(0x10);
      *puVar9 = uVar3;
      p_Var2 = evstate->cur_event;
      *(_event_item **)(puVar9 + 2) = p_Var2;
      p_Var2->ref_count = p_Var2->ref_count + 1;
      INT_CMadd_delayed_task(cm,(int)tp->tv_sec,(int)tp->tv_usec,EVdelayed_submit_func,puVar9);
    }
  }
  return;
}

Assistant:

static void
internal_cod_submit_general(cod_exec_context ec, int port, void *data, void *type_info, attr_list attrs, struct timeval *tp)
{
    struct ev_state_data *ev_state = (void*)cod_get_client_data(ec, 0x34567890);
    CManager cm = ev_state->cm;
    event_path_data evp = ev_state->cm->evp;
    event_item *event;
    EVstone target_stone = port_to_stone(ev_state, port);

    if (target_stone == -1) {
        printf("Port %d on stone %d invalid\n", port, ev_state->stone);
	return;
    }

    assert(CManager_locked(cm));
    ev_state->did_output++;
    if (ev_state->cur_event && data == ev_state->cur_event->decoded_event) {
	CMtrace_out(cm, EVerbose,
		    "Internal COD submit, resubmission of current input event to stone %d\n",
		    target_stone);
	if (tp) {
	    /* delayed event */
	    struct delayed_event *ev = malloc(sizeof(struct delayed_event));
	    ev->to_stone = target_stone;
	    ev->event = ev_state->cur_event;
	    ev_state->cur_event->ref_count++;
	    INT_CMadd_delayed_task(cm, tp->tv_sec, tp->tv_usec, EVdelayed_submit_func, (void*)ev);
	} else {
	    internal_path_submit(ev_state->cm, target_stone, ev_state->cur_event);
	}
    } else {
	FMFormat event_format = NULL;
	CMtrace_out(cm, EVerbose,
		    "Internal COD submit, submission of new data to stone %d\n",
		    target_stone);
	if (event_format == NULL) {
	    event_format = EVregister_format_set(cm, (FMStructDescList) type_info);
	    if (event_format == NULL) {
		printf("Bad format information on submit\n");
		return;
	    }
	}
	event = get_free_event(evp);
	event->event_encoded = 0;
	event->decoded_event = data;
	event->reference_format = event_format;
	event->format = NULL;
/*	event->free_func = cod_free_wrapper;*/
	event->free_func = NULL;
	event->free_arg = event;
	event->attrs = add_ref_attr_list(attrs);
	event->cm = cm;
	cod_encode_event(cm, event);  /* map to memory we trust */
	event->event_encoded = 1;
	event->decoded_event = NULL;  /* lose old data */
	if (tp) {
	    /* delayed event */
	    struct delayed_event {
		EVstone to_stone;
		event_item *event;
	    };
	    CMTaskHandle handle;
	    struct delayed_event *ev = malloc(sizeof(struct delayed_event));
	    ev->to_stone = target_stone;
	    ev->event = event;
	    handle = INT_CMadd_delayed_task(cm, tp->tv_sec, tp->tv_usec, EVdelayed_submit_func, (void*)ev);
	    free(handle);
	} else {
	    internal_path_submit(cm, target_stone, event);
	    return_event(cm->evp, event);
	}
    }
}